

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

void __thiscall google::anon_unknown_1::FlagValue::CopyFrom(FlagValue *this,FlagValue *x)

{
  FlagValue *x_local;
  FlagValue *this_local;
  
  if (this->type_ == x->type_) {
    switch(this->type_) {
    case '\0':
      *(byte *)this->value_buffer_ = *x->value_buffer_ & 1;
      break;
    case '\x01':
      *(undefined4 *)this->value_buffer_ = *x->value_buffer_;
      break;
    case '\x02':
      *(undefined4 *)this->value_buffer_ = *x->value_buffer_;
      break;
    case '\x03':
      *(undefined8 *)this->value_buffer_ = *x->value_buffer_;
      break;
    case '\x04':
      *(undefined8 *)this->value_buffer_ = *x->value_buffer_;
      break;
    case '\x05':
      *(undefined8 *)this->value_buffer_ = *x->value_buffer_;
      break;
    case '\x06':
      std::__cxx11::string::operator=((string *)this->value_buffer_,(string *)x->value_buffer_);
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/gflags.cc"
                    ,0x1d0,
                    "void google::(anonymous namespace)::FlagValue::CopyFrom(const FlagValue &)");
    }
    return;
  }
  __assert_fail("type_ == x.type_",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/gflags.cc"
                ,0x1c7,"void google::(anonymous namespace)::FlagValue::CopyFrom(const FlagValue &)")
  ;
}

Assistant:

void FlagValue::CopyFrom(const FlagValue& x) {
  assert(type_ == x.type_);
  switch (type_) {
    case FV_BOOL:   SET_VALUE_AS(bool, OTHER_VALUE_AS(x, bool));      break;
    case FV_INT32:  SET_VALUE_AS(int32, OTHER_VALUE_AS(x, int32));    break;
    case FV_UINT32: SET_VALUE_AS(uint32, OTHER_VALUE_AS(x, uint32));  break;
    case FV_INT64:  SET_VALUE_AS(int64, OTHER_VALUE_AS(x, int64));    break;
    case FV_UINT64: SET_VALUE_AS(uint64, OTHER_VALUE_AS(x, uint64));  break;
    case FV_DOUBLE: SET_VALUE_AS(double, OTHER_VALUE_AS(x, double));  break;
    case FV_STRING: SET_VALUE_AS(string, OTHER_VALUE_AS(x, string));  break;
    default: assert(false);  // unknown type
  }
}